

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Compaction * __thiscall leveldb::VersionSet::PickCompaction(VersionSet *this)

{
  int *piVar1;
  pointer *pppFVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Version *pVVar5;
  iterator iVar6;
  FileMetaData *pFVar7;
  size_type sVar8;
  size_type sVar9;
  FileMetaData **__args;
  int iVar10;
  Compaction *this_00;
  pointer ppFVar11;
  FileMetaData **ppFVar12;
  ulong uVar13;
  long lVar14;
  uint level;
  long in_FS_OFFSET;
  FileMetaData *f;
  InternalKey largest;
  InternalKey smallest;
  FileMetaData *local_80;
  InternalKey local_78;
  InternalKey local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar5 = this->current_;
  if (1.0 <= pVVar5->compaction_score_) {
    level = pVVar5->compaction_level_;
    lVar14 = (long)(int)level;
    if (lVar14 < 0) {
      __assert_fail("level >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x4e9,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    if (5 < level) {
      __assert_fail("level + 1 < config::kNumLevels",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x4ea,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    this_00 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_00,this->options_,level);
    ppFVar11 = this->current_->files_[lVar14].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (this->current_->files_[lVar14].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
      uVar13 = 0;
      do {
        pFVar7 = ppFVar11[uVar13];
        sVar8 = this->compact_pointer_[lVar14]._M_string_length;
        local_80 = pFVar7;
        if (sVar8 == 0) {
LAB_0066daf1:
          iVar6._M_current =
               this_00->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              this_00->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
            _M_realloc_insert<leveldb::FileMetaData*const&>
                      ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                       this_00->inputs_,iVar6,&local_80);
          }
          else {
            *iVar6._M_current = pFVar7;
            pppFVar2 = &this_00->inputs_[0].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar2 = *pppFVar2 + 1;
          }
          break;
        }
        sVar9 = (pFVar7->largest).rep_._M_string_length;
        if (sVar9 == 0) {
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_58.rep_._M_dataplus._M_p = (pFVar7->largest).rep_._M_dataplus._M_p;
        local_78.rep_._M_dataplus._M_p = this->compact_pointer_[lVar14]._M_dataplus._M_p;
        local_78.rep_._M_string_length = sVar8;
        local_58.rep_._M_string_length = sVar9;
        iVar10 = InternalKeyComparator::Compare(&this->icmp_,(Slice *)&local_58,(Slice *)&local_78);
        if (0 < iVar10) goto LAB_0066daf1;
        uVar13 = uVar13 + 1;
        ppFVar11 = this->current_->files_[lVar14].
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)this->current_->files_[lVar14].
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >>
                               3));
    }
    ppFVar12 = this_00->inputs_[0].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    iVar6._M_current =
         this_00->inputs_[0].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar12 == iVar6._M_current) {
      __args = this->current_->files_[lVar14].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppFVar12 ==
          this_00->inputs_[0].
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
        _M_realloc_insert<leveldb::FileMetaData*const&>
                  ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                   this_00->inputs_,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        pppFVar2 = &this_00->inputs_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar2 = *pppFVar2 + 1;
      }
    }
  }
  else {
    if (pVVar5->file_to_compact_ == (FileMetaData *)0x0) {
      this_00 = (Compaction *)0x0;
      goto LAB_0066dc4f;
    }
    level = pVVar5->file_to_compact_level_;
    this_00 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_00,this->options_,level);
    ppFVar12 = &this->current_->file_to_compact_;
    iVar6._M_current =
         this_00->inputs_[0].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        this_00->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
      _M_realloc_insert<leveldb::FileMetaData*const&>
                ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                 this_00->inputs_,iVar6,ppFVar12);
    }
    else {
      *iVar6._M_current = *ppFVar12;
      pppFVar2 = &this_00->inputs_[0].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar2 = *pppFVar2 + 1;
    }
  }
  pVVar5 = this->current_;
  this_00->input_version_ = pVVar5;
  piVar1 = &pVVar5->refs_;
  *piVar1 = *piVar1 + 1;
  if (level == 0) {
    paVar3 = &local_58.rep_.field_2;
    local_58.rep_._M_string_length = 0;
    local_58.rep_.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_78.rep_.field_2;
    local_78.rep_._M_string_length = 0;
    local_78.rep_.field_2._M_local_buf[0] = '\0';
    local_78.rep_._M_dataplus._M_p = (pointer)paVar4;
    local_58.rep_._M_dataplus._M_p = (pointer)paVar3;
    GetRange(this,this_00->inputs_,&local_58,&local_78);
    Version::GetOverlappingInputs(this->current_,0,&local_58,&local_78,this_00->inputs_);
    if (this_00->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        this_00->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!c->inputs_[0].empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x50d,"Compaction *leveldb::VersionSet::PickCompaction()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.rep_._M_dataplus._M_p != paVar4) {
      operator_delete(local_78.rep_._M_dataplus._M_p,
                      CONCAT71(local_78.rep_.field_2._M_allocated_capacity._1_7_,
                               local_78.rep_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.rep_._M_dataplus._M_p != paVar3) {
      operator_delete(local_58.rep_._M_dataplus._M_p,
                      CONCAT71(local_58.rep_.field_2._M_allocated_capacity._1_7_,
                               local_58.rep_.field_2._M_local_buf[0]) + 1);
    }
  }
  SetupOtherInputs(this,this_00);
LAB_0066dc4f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

Compaction* VersionSet::PickCompaction() {
  Compaction* c;
  int level;

  // We prefer compactions triggered by too much data in a level over
  // the compactions triggered by seeks.
  const bool size_compaction = (current_->compaction_score_ >= 1);
  const bool seek_compaction = (current_->file_to_compact_ != nullptr);
  if (size_compaction) {
    level = current_->compaction_level_;
    assert(level >= 0);
    assert(level + 1 < config::kNumLevels);
    c = new Compaction(options_, level);

    // Pick the first file that comes after compact_pointer_[level]
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      FileMetaData* f = current_->files_[level][i];
      if (compact_pointer_[level].empty() ||
          icmp_.Compare(f->largest.Encode(), compact_pointer_[level]) > 0) {
        c->inputs_[0].push_back(f);
        break;
      }
    }
    if (c->inputs_[0].empty()) {
      // Wrap-around to the beginning of the key space
      c->inputs_[0].push_back(current_->files_[level][0]);
    }
  } else if (seek_compaction) {
    level = current_->file_to_compact_level_;
    c = new Compaction(options_, level);
    c->inputs_[0].push_back(current_->file_to_compact_);
  } else {
    return nullptr;
  }

  c->input_version_ = current_;
  c->input_version_->Ref();

  // Files in level 0 may overlap each other, so pick up all overlapping ones
  if (level == 0) {
    InternalKey smallest, largest;
    GetRange(c->inputs_[0], &smallest, &largest);
    // Note that the next call will discard the file we placed in
    // c->inputs_[0] earlier and replace it with an overlapping set
    // which will include the picked file.
    current_->GetOverlappingInputs(0, &smallest, &largest, &c->inputs_[0]);
    assert(!c->inputs_[0].empty());
  }

  SetupOtherInputs(c);

  return c;
}